

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<google::protobuf::SingleArena_CopyConstructSSO_Test>::
CreateTest(ParameterizedTestFactory<google::protobuf::SingleArena_CopyConstructSSO_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<bool>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  google::protobuf::SingleArena_CopyConstructSSO_Test::SingleArena_CopyConstructSSO_Test
            ((SingleArena_CopyConstructSSO_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }